

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  bool bVar2;
  long lVar3;
  Test *this_00;
  long lVar4;
  
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  if (this->should_run_ != false) {
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(&UnitTest::GetInstance::instance,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1,this);
    lVar3 = std::chrono::_V2::system_clock::now();
    (this->result_).start_timestamp_ = lVar3 / 1000000;
    lVar3 = std::chrono::_V2::steady_clock::now();
    UnitTest::GetInstance();
    UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
    this_00 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar2 = Test::HasFatalFailure();
    if (!bVar2) {
      bVar2 = Test::IsSkipped();
      if (!bVar2) {
        Test::Run(this_00);
      }
    }
    if (this_00 != (Test *)0x0) {
      UnitTest::GetInstance();
      UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (this_00,0x14d496,(char *)0x0);
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
    (this->result_).elapsed_time_ = (lVar4 - lVar3) / 1000000;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1);
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(&UnitTest::GetInstance::instance,(TestInfo *)0x0);
    return;
  }
  if ((this->is_disabled_ == true) && (this->matches_filter_ == true)) {
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[9])(pTVar1,this);
    return;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();
  if (!should_run_) {
    if (is_disabled_ && matches_filter_) repeater->OnTestDisabled(*this);
    return;
  }

  // Tells UnitTest where to store test result.
  UnitTest::GetInstance()->set_current_test_info(this);

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);
  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;
  UnitTest::GetInstance()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    UnitTest::GetInstance()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}